

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_appender<char>
fmt::v11::detail::
do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>,fmt::v11::detail::digit_grouping<char>>
          (basic_appender<char> out,decimal_fp<float> *f,format_specs *specs,sign s,locale_ref loc)

{
  locale_ref loc_00;
  iterator it;
  bool bVar1;
  char cVar2;
  presentation_type pVar3;
  make_unsigned_t<int> mVar4;
  int iVar5;
  int iVar6;
  int in_ECX;
  basic_specs *in_RDX;
  undefined4 *in_RSI;
  buffer<char> *in_RDI;
  undefined8 in_R8;
  bool pointy;
  int num_zeros;
  digit_grouping<char> grouping_1;
  int num_zeros_3;
  digit_grouping<char> grouping;
  int num_zeros_2;
  int exp;
  anon_class_28_8_ce6b8c4d write;
  char exp_char;
  int exp_digits;
  int abs_output_exp;
  int num_zeros_1;
  anon_class_20_2_abcdb1c7 use_exp_format;
  int output_exp;
  char decimal_point;
  size_t size;
  char zero;
  int significand_size;
  significand_type significand;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  undefined4 uVar7;
  size_t in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  basic_appender<char> in_stack_fffffffffffffd78;
  basic_appender<char> out_00;
  int local_27c;
  undefined8 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  undefined4 in_stack_fffffffffffffda0;
  undefined2 in_stack_fffffffffffffda4;
  undefined1 uVar8;
  undefined1 in_stack_fffffffffffffda7;
  undefined1 uVar9;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  locale_ref in_stack_fffffffffffffdb0;
  int local_20c;
  buffer<char> local_1b8 [2];
  int local_174;
  int *local_170;
  undefined4 *local_168;
  int *local_160;
  undefined4 *local_158;
  undefined1 *local_150;
  basic_specs *local_148;
  char *local_140;
  int *local_138;
  undefined1 *local_130;
  buffer<char> *local_128;
  undefined8 local_110;
  undefined1 local_108 [64];
  int local_c8;
  int local_c4;
  buffer<char> *local_c0;
  buffer<char> *local_b8;
  buffer<char> *local_b0;
  basic_appender<char> local_a8;
  buffer<char> *local_a0;
  int local_94;
  undefined4 local_90;
  int local_8c;
  char local_88;
  int local_84;
  undefined1 local_80;
  undefined1 local_7f;
  int local_7c;
  undefined1 local_75;
  undefined4 local_74;
  int local_70;
  int local_6c;
  basic_specs local_68;
  basic_specs local_60;
  int local_58;
  int local_54;
  undefined8 local_50;
  char local_41;
  ulong local_40;
  undefined1 local_35;
  int local_34;
  undefined4 local_30;
  int local_2c;
  basic_specs *local_28;
  undefined4 *local_20;
  undefined8 local_18;
  buffer<char> *local_10;
  buffer<char> *local_8;
  
  iVar6 = (int)((ulong)in_stack_fffffffffffffd88 >> 0x20);
  local_30 = *in_RSI;
  local_2c = in_ECX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_18 = in_R8;
  local_10 = in_RDI;
  local_34 = get_significand_size<float>((decimal_fp<float> *)0x38933c);
  local_35 = 0x30;
  mVar4 = to_unsigned<int>(0);
  local_40 = (ulong)(mVar4 + (local_2c != 0));
  bVar1 = basic_specs::localized(local_28);
  if (bVar1) {
    local_50 = local_18;
    loc_00.locale_._4_4_ = in_stack_fffffffffffffd64;
    loc_00.locale_._0_4_ = in_stack_fffffffffffffd60;
    cVar2 = decimal_point<char>(loc_00);
    uVar7 = CONCAT13(cVar2,(int3)in_stack_fffffffffffffdac);
  }
  else {
    uVar7 = CONCAT13(0x2e,(int3)in_stack_fffffffffffffdac);
  }
  local_41 = (char)((uint)uVar7 >> 0x18);
  local_58 = local_20[1] + local_34 + -1;
  local_68 = *local_28;
  local_60 = local_28[1];
  local_54 = local_58;
  bVar1 = do_write_float<char,_fmt::v11::basic_appender<char>,_fmt::v11::detail::dragonbox::decimal_fp<float>,_fmt::v11::detail::digit_grouping<char>_>
          ::anon_class_20_2_abcdb1c7::operator()
                    ((anon_class_20_2_abcdb1c7 *)in_stack_fffffffffffffd78.container);
  if (bVar1) {
    local_6c = 0;
    bVar1 = basic_specs::alt(local_28);
    if (bVar1) {
      local_6c = *(int *)local_28[1].fill_data_ - local_34;
      if (local_6c < 0) {
        local_6c = 0;
      }
      mVar4 = to_unsigned<int>(0);
      local_40 = mVar4 + local_40;
    }
    else if (local_34 == 1) {
      local_41 = '\0';
    }
    iVar6 = local_54;
    if (local_54 < 0) {
      iVar6 = -local_54;
    }
    local_74 = 2;
    if ((99 < iVar6) && (local_74 = 3, 999 < iVar6)) {
      local_74 = 4;
    }
    local_70 = iVar6;
    mVar4 = to_unsigned<int>(0);
    local_40 = mVar4 + local_40;
    bVar1 = basic_specs::upper(local_28);
    uVar8 = 0x65;
    uVar9 = 0x45;
    if (!bVar1) {
      uVar9 = 0x65;
    }
    local_94 = local_2c;
    local_90 = local_30;
    local_8c = local_34;
    local_88 = local_41;
    local_84 = local_6c;
    local_80 = 0x30;
    local_7c = local_54;
    local_7f = uVar9;
    local_75 = uVar9;
    if ((int)local_28[1].data_ < 1) {
      local_a8.container = local_10;
      local_c0 = local_10;
      local_b8 = (buffer<char> *)
                 reserve<char>(in_stack_fffffffffffffd78,
                               CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
      it.container._4_4_ = uVar7;
      it.container._0_4_ = iVar6;
      local_b0 = (buffer<char> *)
                 do_write_float<char,_fmt::v11::basic_appender<char>,_fmt::v11::detail::dragonbox::decimal_fp<float>,_fmt::v11::detail::digit_grouping<char>_>
                 ::anon_class_28_8_ce6b8c4d::operator()
                           ((anon_class_28_8_ce6b8c4d *)
                            CONCAT17(uVar9,CONCAT16(uVar8,CONCAT24(in_stack_fffffffffffffda4,
                                                                   in_stack_fffffffffffffda0))),it);
      local_8 = (buffer<char> *)
                base_iterator<fmt::v11::basic_appender<char>>
                          (local_a8,(basic_appender<char>)local_b0);
    }
    else {
      local_a0 = local_10;
      local_8 = (buffer<char> *)
                write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>const&,fmt::v11::format_specs_const&,fmt::v11::sign,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                          (in_stack_fffffffffffffd78,
                           (format_specs *)
                           CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                           in_stack_fffffffffffffd68,
                           (anon_class_28_8_ce6b8c4d *)
                           CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    }
  }
  else {
    local_c4 = local_20[1] + local_34;
    if ((int)local_20[1] < 0) {
      if (local_c4 < 1) {
        local_20c = -local_c4;
        if (((local_34 == 0) && (-1 < *(int *)local_28[1].fill_data_)) &&
           (*(int *)local_28[1].fill_data_ < local_20c)) {
          local_20c = *(int *)local_28[1].fill_data_;
        }
        uVar7 = CONCAT13(1,(int3)in_stack_fffffffffffffd64);
        if ((local_20c == 0) && (uVar7 = CONCAT13(1,(int3)in_stack_fffffffffffffd64), local_34 == 0)
           ) {
          bVar1 = basic_specs::alt(local_28);
          uVar7 = CONCAT13(bVar1,(int3)uVar7);
        }
        iVar6 = ((char)((uint)uVar7 >> 0x18) != '\0') + 1;
        mVar4 = to_unsigned<int>(0);
        local_40 = (iVar6 + mVar4) + local_40;
        local_8 = (buffer<char> *)
                  write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>const&,fmt::v11::format_specs_const&,fmt::v11::sign,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_4_>
                            (in_stack_fffffffffffffd78,
                             (format_specs *)
                             CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                             in_stack_fffffffffffffd68,
                             (anon_class_56_7_88befd79 *)CONCAT44(uVar7,iVar6));
      }
      else {
        bVar1 = basic_specs::alt(local_28);
        if (bVar1) {
          local_27c = *(int *)local_28[1].fill_data_ - local_34;
        }
        else {
          local_27c = 0;
        }
        local_174 = local_27c;
        iVar5 = max_of<int>(local_27c,0);
        local_40 = local_40 + (iVar5 + 1);
        basic_specs::localized(local_28);
        out_00.container = local_1b8;
        digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
                  ((digit_grouping<char> *)CONCAT44(uVar7,in_stack_fffffffffffffda8),
                   in_stack_fffffffffffffdb0,(bool)in_stack_fffffffffffffda7);
        digit_grouping<char>::count_separators
                  ((digit_grouping<char> *)
                   CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),iVar6);
        mVar4 = to_unsigned<int>(0);
        local_40 = local_40 + mVar4;
        local_8 = (buffer<char> *)
                  write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>const&,fmt::v11::format_specs_const&,fmt::v11::sign,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_3_>
                            (out_00,(format_specs *)CONCAT44(mVar4,in_stack_fffffffffffffd70),
                             in_stack_fffffffffffffd68,
                             (anon_class_64_8_085c650e *)
                             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
        digit_grouping<char>::~digit_grouping
                  ((digit_grouping<char> *)
                   CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      }
    }
    else {
      mVar4 = to_unsigned<int>(0);
      local_40 = mVar4 + local_40;
      local_c8 = *(int *)local_28[1].fill_data_ - local_c4;
      abort_fuzzing_if(false);
      bVar1 = basic_specs::alt(local_28);
      if (bVar1) {
        local_40 = local_40 + 1;
        if ((local_c8 < 1) && (pVar3 = basic_specs::type(local_28), pVar3 != fixed)) {
          local_c8 = 0;
        }
        if (0 < local_c8) {
          mVar4 = to_unsigned<int>(0);
          local_40 = mVar4 + local_40;
        }
      }
      local_110 = local_18;
      basic_specs::localized(local_28);
      digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
                ((digit_grouping<char> *)CONCAT44(uVar7,in_stack_fffffffffffffda8),
                 in_stack_fffffffffffffdb0,(bool)in_stack_fffffffffffffda7);
      digit_grouping<char>::count_separators
                ((digit_grouping<char> *)
                 CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),iVar6);
      mVar4 = to_unsigned<int>(0);
      local_40 = local_40 + mVar4;
      local_128 = local_10;
      local_170 = &local_2c;
      local_168 = &local_30;
      local_160 = &local_34;
      local_158 = local_20;
      local_150 = local_108;
      local_148 = local_28;
      local_140 = &local_41;
      local_138 = &local_c8;
      local_130 = &local_35;
      local_8 = (buffer<char> *)
                write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::dragonbox::decimal_fp<float>const&,fmt::v11::format_specs_const&,fmt::v11::sign,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_2_>
                          (in_stack_fffffffffffffd78,
                           (format_specs *)
                           CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                           in_stack_fffffffffffffd68,
                           (anon_class_72_9_eb40e20e *)
                           CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      digit_grouping<char>::~digit_grouping
                ((digit_grouping<char> *)
                 CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    }
  }
  return (basic_appender<char>)local_8;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const format_specs& specs, sign s,
                                    locale_ref loc) -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  size_t size = to_unsigned(significand_size) + (s != sign::none ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point = specs.localized() ? detail::decimal_point<Char>(loc)
                                         : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (specs.type() == presentation_type::exp) return true;
    if (specs.type() == presentation_type::fixed) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (specs.precision > 0 ? specs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (specs.alt()) {
      num_zeros = specs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = specs.upper() ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0
               ? write_padded<Char, align::right>(out, specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = specs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (specs.alt()) {
      ++size;
      if (num_zeros <= 0 && specs.type() != presentation_type::fixed)
        num_zeros = 0;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!specs.alt()) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = specs.alt() ? specs.precision - significand_size : 0;
    size += 1 + static_cast<unsigned>(max_of(num_zeros, 0));
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && specs.precision >= 0 &&
      specs.precision < num_zeros) {
    num_zeros = specs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || specs.alt();
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
    if (s != sign::none) *it++ = detail::getsign<Char>(s);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}